

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeFormatter.cpp
# Opt level: O0

void __thiscall
cali::TreeFormatter::TreeFormatterImpl::add
          (TreeFormatterImpl *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  reference this_00;
  SnapshotTreeNode *list_00;
  EntryList *pEVar1;
  bool bVar2;
  int iVar3;
  vector<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
  *this_01;
  reference this_02;
  pointer ppVar4;
  pointer ppVar5;
  int *piVar6;
  Variant VVar7;
  pair<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo> local_208;
  int local_1d4;
  undefined1 local_1d0 [8];
  ColumnInfo ci;
  allocator<char> local_181;
  string local_180 [32];
  Attribute local_160;
  undefined1 local_158 [8];
  Variant v;
  _Self local_140;
  iterator ait;
  string name;
  _Self local_110;
  iterator it;
  int local_e4;
  reference ppStack_e0;
  int len;
  pair<cali::Attribute,_cali::Variant> *entry;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>
  *__range2;
  vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>
  *data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
  *__range1;
  IsPathPredicateFn local_98;
  undefined1 local_78 [8];
  vector<cali::Attribute,_std::allocator<cali::Attribute>_> path_keys;
  anon_class_1_0_00000001 local_49;
  IsPathPredicateFn local_48;
  SnapshotTreeNode *local_28;
  SnapshotTreeNode *node;
  EntryList *list_local;
  CaliperMetadataAccessInterface *db_local;
  TreeFormatterImpl *this_local;
  
  local_28 = (SnapshotTreeNode *)0x0;
  node = (SnapshotTreeNode *)list;
  list_local = (EntryList *)db;
  db_local = (CaliperMetadataAccessInterface *)this;
  if ((this->m_use_nested & 1U) == 0) {
    get_path_keys((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)local_78,this,db);
    pEVar1 = list_local;
    list_00 = node;
    __range1 = (vector<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
                *)local_78;
    std::function<bool(cali::Attribute_const&,cali::Variant_const&)>::
    function<cali::TreeFormatter::TreeFormatterImpl::add(cali::CaliperMetadataAccessInterface_const&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)::_lambda(cali::Attribute_const&,cali::Variant_const&)_2_,void>
              ((function<bool(cali::Attribute_const&,cali::Variant_const&)> *)&local_98,
               (anon_class_8_1_ff12d86e *)&__range1);
    local_28 = SnapshotTree::add_snapshot
                         (&this->m_tree,(CaliperMetadataAccessInterface *)pEVar1,
                          (EntryList *)list_00,&local_98);
    std::function<bool_(const_cali::Attribute_&,_const_cali::Variant_&)>::~function(&local_98);
    std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::~vector
              ((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)local_78);
  }
  else {
    std::function<bool(cali::Attribute_const&,cali::Variant_const&)>::
    function<cali::TreeFormatter::TreeFormatterImpl::add(cali::CaliperMetadataAccessInterface_const&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)::_lambda(cali::Attribute_const&,cali::Variant_const&)_1_,void>
              ((function<bool(cali::Attribute_const&,cali::Variant_const&)> *)&local_48,&local_49);
    local_28 = SnapshotTree::add_snapshot(&this->m_tree,db,list,&local_48);
    std::function<bool_(const_cali::Attribute_&,_const_cali::Variant_&)>::~function(&local_48);
  }
  if (local_28 != (SnapshotTreeNode *)0x0) {
    this_01 = SnapshotTreeNode::records(local_28);
    __end1 = std::
             vector<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
             ::begin(this_01);
    data = (vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>
            *)std::
              vector<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
              ::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_*,_std::vector<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>_>
                                       *)&data), bVar2) {
      this_02 = __gnu_cxx::
                __normal_iterator<const_std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_*,_std::vector<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>_>
                ::operator*(&__end1);
      __end2 = std::
               vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>
               ::begin(this_02);
      entry = (pair<cali::Attribute,_cali::Variant> *)
              std::
              vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>
              ::end(this_02);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::pair<cali::Attribute,_cali::Variant>_*,_std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>
                                         *)&entry), bVar2) {
        ppStack_e0 = __gnu_cxx::
                     __normal_iterator<const_std::pair<cali::Attribute,_cali::Variant>_*,_std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>
                     ::operator*(&__end2);
        Variant::to_string_abi_cxx11_((string *)&it,&ppStack_e0->second);
        iVar3 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&it);
        local_e4 = iVar3;
        local_110._M_node =
             (_Base_ptr)
             std::
             map<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo,_std::less<cali::Attribute>,_std::allocator<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>_>
             ::find(&this->m_column_info,&ppStack_e0->first);
        name.field_2._8_8_ =
             std::
             map<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo,_std::less<cali::Attribute>,_std::allocator<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>_>
             ::end(&this->m_column_info);
        bVar2 = std::operator==(&local_110,(_Self *)((long)&name.field_2 + 8));
        if (bVar2) {
          Attribute::name_abi_cxx11_((string *)&ait,&ppStack_e0->first);
          local_140._M_node =
               (_Base_ptr)
               CaliperMetadataDB::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&(this->m_spec).aliases,(key_type *)&ait);
          v.m_v.value = (anon_union_8_7_33918203_for_value)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::end(&(this->m_spec).aliases);
          bVar2 = std::operator!=(&local_140,(_Self *)&v.m_v.value);
          pEVar1 = list_local;
          this_00 = ppStack_e0;
          if (bVar2) {
            ppVar4 = CaliperMetadataDB::std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_140);
            std::__cxx11::string::operator=((string *)&ait,(string *)&ppVar4->second);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_180,"attribute.alias",&local_181);
            local_160.m_node =
                 (Node *)(*(code *)(((pEVar1->
                                     super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->m_value).m_v.value)
                                   (pEVar1,local_180);
            VVar7 = Attribute::get(&this_00->first,&local_160);
            v.m_v.type_and_size = (uint64_t)VVar7.m_v.value;
            local_158 = (undefined1  [8])VVar7.m_v.type_and_size;
            std::__cxx11::string::~string(local_180);
            std::allocator<char>::~allocator(&local_181);
            bVar2 = Variant::empty((Variant *)local_158);
            if (!bVar2) {
              Variant::to_string_abi_cxx11_((string *)&ci.width,(Variant *)local_158);
              std::__cxx11::string::operator=((string *)&ait,(string *)&ci.width);
              std::__cxx11::string::~string((string *)&ci.width);
            }
          }
          std::__cxx11::string::string((string *)local_1d0,(string *)&ait);
          local_1d4 = std::__cxx11::string::size();
          piVar6 = std::max<int>(&local_e4,&local_1d4);
          ci.display_name.field_2._8_4_ = *piVar6;
          std::make_pair<cali::Attribute_const&,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo&>
                    (&local_208,&ppStack_e0->first,(ColumnInfo *)local_1d0);
          std::
          map<cali::Attribute,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
          ::insert<std::pair<cali::Attribute,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>
                    ((map<cali::Attribute,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
                      *)&this->m_column_info,&local_208);
          std::pair<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>::~pair
                    (&local_208);
          ColumnInfo::~ColumnInfo((ColumnInfo *)local_1d0);
          std::__cxx11::string::~string((string *)&ait);
        }
        else {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>
                   ::operator->(&local_110);
          piVar6 = std::max<int>(&(ppVar5->second).width,&local_e4);
          iVar3 = *piVar6;
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>
                   ::operator->(&local_110);
          (ppVar5->second).width = iVar3;
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<cali::Attribute,_cali::Variant>_*,_std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_*,_std::vector<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void add(const CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        const SnapshotTreeNode* node = nullptr;

        if (m_use_nested) {
            node =
                m_tree.add_snapshot(db, list, [](const Attribute& attr, const Variant&) { return attr.is_nested(); });
        } else {
            auto path_keys = get_path_keys(db);

            node = m_tree.add_snapshot(db, list, [&path_keys](const Attribute& attr, const Variant&) {
                return (std::find(std::begin(path_keys), std::end(path_keys), attr) != std::end(path_keys));
            });
        }

        if (!node)
            return;

        // update column widths

        for (auto& data : node->records()) {
            for (auto& entry : data) {
                int  len = entry.second.to_string().size();
                auto it  = m_column_info.find(entry.first);

                if (it == m_column_info.end()) {
                    std::string name = entry.first.name();

                    auto ait = m_spec.aliases.find(name);
                    if (ait != m_spec.aliases.end())
                        name = ait->second;
                    else {
                        Variant v = entry.first.get(db.get_attribute("attribute.alias"));

                        if (!v.empty())
                            name = v.to_string();
                    }

                    ColumnInfo ci { name, std::max<int>(len, name.size()) };

                    m_column_info.insert(std::make_pair(entry.first, ci));
                } else
                    it->second.width = std::max(it->second.width, len);
            }
        }
    }